

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcesdialog.cpp
# Opt level: O0

void __thiscall FSSSourcesDialog::add_source(FSSSourcesDialog *this,PSource *source)

{
  QFormLayout *pQVar1;
  int iVar2;
  DataSourceType DVar3;
  QHBoxLayout *pQVar4;
  element_type *peVar5;
  char *pcVar6;
  QLabel *pQVar7;
  QPathEdit *pQVar8;
  QFlags<Qt::AlignmentFlag> local_10c;
  string local_108 [32];
  QString local_e8;
  shared_ptr<Data::Source> local_d0;
  DataSourceType local_bc;
  QPathEdit *pQStack_b8;
  DataSourceType type;
  QPathEdit *path_edit;
  QString local_a8;
  QPixmap local_90 [28];
  QFlags<Qt::WindowType> local_74;
  QLabel *local_70;
  QLabel *label;
  QString local_48;
  QHBoxLayout *local_20;
  QHBoxLayout *line_layout;
  PSource *source_local;
  FSSSourcesDialog *this_local;
  
  line_layout = (QHBoxLayout *)source;
  source_local = (PSource *)this;
  pQVar4 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar4);
  pQVar1 = this->layout;
  local_20 = pQVar4;
  peVar5 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )source);
  (**peVar5->_vptr_Source)();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  QString::QString(&local_48,pcVar6);
  QFormLayout::addRow((QString *)pQVar1,(QLayout *)&local_48);
  QString::~QString(&local_48);
  std::__cxx11::string::~string((string *)&label);
  pQVar7 = (QLabel *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags(&local_74);
  QLabel::QLabel(pQVar7,(QWidget *)this,(QFlags_conflict1 *)(ulong)local_74.i);
  local_70 = pQVar7;
  peVar5 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )source);
  iVar2 = (*peVar5->_vptr_Source[2])();
  pcVar6 = ":/icons/Actions-edit-delete-icon.png";
  if ((char)iVar2 != '\0') {
    pcVar6 = ":/icons/Actions-dialog-ok-apply-icon.png";
  }
  QString::QString(&local_a8,pcVar6);
  QFlags<Qt::ImageConversionFlag>::QFlags
            ((QFlags<Qt::ImageConversionFlag> *)((long)&path_edit + 4),AutoColor);
  QPixmap::QPixmap(local_90,&local_a8,(char *)0x0,(QFlags_conflict1 *)(ulong)path_edit._4_4_);
  QLabel::setPixmap((QPixmap *)pQVar7);
  QPixmap::~QPixmap(local_90);
  QString::~QString(&local_a8);
  pQVar4 = local_20;
  pQVar7 = local_70;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&path_edit);
  QBoxLayout::addWidget((QWidget *)pQVar4,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pQVar8 = (QPathEdit *)operator_new(0xb0);
  QPathEdit::QPathEdit(pQVar8,(QWidget *)this,SeperatedButton);
  pQStack_b8 = pQVar8;
  std::shared_ptr<Data::Source>::shared_ptr(&local_d0,source);
  DVar3 = FSSDataModel::getType(&local_d0);
  std::shared_ptr<Data::Source>::~shared_ptr(&local_d0);
  local_bc = DVar3;
  QPathEdit::setPathMode(pQStack_b8,(uint)(DVar3 != DataSourceTypeDos));
  pQVar8 = pQStack_b8;
  peVar5 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )source);
  (*peVar5->_vptr_Source[1])();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  QString::QString(&local_e8,pcVar6);
  QPathEdit::setPath(pQVar8,&local_e8,false);
  QString::~QString(&local_e8);
  std::__cxx11::string::~string(local_108);
  pQVar4 = local_20;
  pQVar8 = pQStack_b8;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_10c);
  QBoxLayout::addWidget((QWidget *)pQVar4,(int)pQVar8,(QFlags_conflict1 *)0x0);
  return;
}

Assistant:

void
FSSSourcesDialog::add_source(Data::PSource source) {
  QHBoxLayout *line_layout = new QHBoxLayout();
  layout->addRow(source->get_name().c_str(), line_layout);

  QLabel *label = new QLabel(this);
  label->setPixmap(QPixmap(source->is_loaded() ?
                           ":/icons/Actions-dialog-ok-apply-icon.png" :
                           ":/icons/Actions-edit-delete-icon.png"));
  line_layout->addWidget(label);

  QPathEdit *path_edit = new QPathEdit(this);
  FSSDataModel::DataSourceType type = FSSDataModel::getType(source);
  path_edit->setPathMode((type == FSSDataModel::DataSourceTypeDos) ?
                         QPathEdit::ExistingFile :
                         QPathEdit::ExistingFolder);
  path_edit->setPath(source->get_path().c_str());
  line_layout->addWidget(path_edit);
}